

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O2

void Saig_SynchTernaryTransferState(Aig_Man_t *pAig,Vec_Ptr_t *vSimInfo,int nWords)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  void *pvVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  int i;
  
  uVar5 = 0;
  uVar6 = (ulong)(uint)nWords;
  if (nWords < 1) {
    uVar6 = uVar5;
  }
  while (i = (int)uVar5, i < pAig->nRegs) {
    pAVar1 = Saig_ManLi(pAig,i);
    pAVar2 = Saig_ManLo(pAig,i);
    pvVar3 = Vec_PtrEntry(vSimInfo,pAVar1->Id);
    pvVar4 = Vec_PtrEntry(vSimInfo,pAVar2->Id);
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      *(undefined4 *)((long)pvVar4 + uVar5 * 4) = *(undefined4 *)((long)pvVar3 + uVar5 * 4);
    }
    uVar5 = (ulong)(i + 1);
  }
  return;
}

Assistant:

void Saig_SynchTernaryTransferState( Aig_Man_t * pAig, Vec_Ptr_t * vSimInfo, int nWords )
{
    Aig_Obj_t * pObjLi, * pObjLo;
    unsigned * pSim0, * pSim1;
    int i, w;
    Saig_ManForEachLiLo( pAig, pObjLi, pObjLo, i )
    {
        pSim0 = (unsigned *)Vec_PtrEntry( vSimInfo, pObjLi->Id );
        pSim1 = (unsigned *)Vec_PtrEntry( vSimInfo, pObjLo->Id );
        for ( w = 0; w < nWords; w++ )
            pSim1[w] = pSim0[w];
    }
}